

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O3

void uenum_reset_63(UEnumeration *en,UErrorCode *status)

{
  if ((en != (UEnumeration *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (en->reset != (UEnumReset *)0x0) {
      (*en->reset)(en,status);
      return;
    }
    *status = U_UNSUPPORTED_ERROR;
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uenum_reset(UEnumeration* en, UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return;
    }
    if (en->reset != NULL) {
        en->reset(en, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
    }
}